

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::TasmanianSparseGrid::integrateHierarchicalFunctions
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,TasmanianSparseGrid *this
          )

{
  TasmanianSparseGrid *this_local;
  vector<double,_std::allocator<double>_> *integrals;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  integrateHierarchicalFunctions(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> integrateHierarchicalFunctions() const{
        std::vector<double> integrals;
        integrateHierarchicalFunctions(integrals);
        return integrals;
    }